

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type.pb.cc
# Opt level: O3

void google::protobuf::Option::MergeImpl(MessageLite *to_msg,MessageLite *from_msg)

{
  uint uVar1;
  ulong uVar2;
  _func_int **pp_Var3;
  Arena *arena;
  Arena *extraout_RDX;
  string *value;
  MessageLite *pMVar4;
  Arena *arena_00;
  
  arena = (Arena *)(to_msg->_internal_metadata_).ptr_;
  arena_00 = arena;
  if (((ulong)arena & 1) != 0) {
    arena_00 = *(Arena **)((ulong)arena & 0xfffffffffffffffe);
  }
  if (from_msg == to_msg) {
    value = (string *)to_msg;
    pMVar4 = from_msg;
    MergeImpl();
    arena = extraout_RDX;
LAB_001c69f0:
    arena = *(Arena **)((ulong)arena & 0xfffffffffffffffe);
  }
  else {
    value = (string *)(from_msg[1]._internal_metadata_.ptr_ & 0xfffffffffffffffc);
    if (value->_M_string_length == 0) goto LAB_001c696c;
    pMVar4 = (MessageLite *)&to_msg[1]._internal_metadata_;
    if (((ulong)arena & 1) != 0) goto LAB_001c69f0;
  }
  internal::ArenaStringPtr::Set<>((ArenaStringPtr *)pMVar4,value,arena);
LAB_001c696c:
  uVar1 = *(uint *)&from_msg[1]._vptr_MessageLite;
  if ((uVar1 & 1) != 0) {
    pMVar4 = (MessageLite *)from_msg[2]._vptr_MessageLite;
    if (pMVar4 == (MessageLite *)0x0) {
      MergeImpl((Option *)&stack0xffffffffffffffd0);
      return;
    }
    if ((MessageLite *)to_msg[2]._vptr_MessageLite == (MessageLite *)0x0) {
      pp_Var3 = (_func_int **)Arena::CopyConstruct<google::protobuf::Any>(arena_00,pMVar4);
      to_msg[2]._vptr_MessageLite = pp_Var3;
    }
    else {
      Any::MergeImpl((MessageLite *)to_msg[2]._vptr_MessageLite,pMVar4);
    }
  }
  *(uint *)&to_msg[1]._vptr_MessageLite = *(uint *)&to_msg[1]._vptr_MessageLite | uVar1;
  uVar2 = (from_msg->_internal_metadata_).ptr_;
  if ((uVar2 & 1) != 0) {
    internal::InternalMetadata::DoMergeFrom<google::protobuf::UnknownFieldSet>
              (&to_msg->_internal_metadata_,(UnknownFieldSet *)((uVar2 & 0xfffffffffffffffe) + 8));
    return;
  }
  return;
}

Assistant:

void Option::MergeImpl(::google::protobuf::MessageLite& to_msg, const ::google::protobuf::MessageLite& from_msg) {
  auto* const _this = static_cast<Option*>(&to_msg);
  auto& from = static_cast<const Option&>(from_msg);
  ::google::protobuf::Arena* arena = _this->GetArena();
  // @@protoc_insertion_point(class_specific_merge_from_start:google.protobuf.Option)
  ABSL_DCHECK_NE(&from, _this);
  ::uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  if (!from._internal_name().empty()) {
    _this->_internal_set_name(from._internal_name());
  }
  cached_has_bits = from._impl_._has_bits_[0];
  if (cached_has_bits & 0x00000001u) {
    ABSL_DCHECK(from._impl_.value_ != nullptr);
    if (_this->_impl_.value_ == nullptr) {
      _this->_impl_.value_ =
          ::google::protobuf::Message::CopyConstruct<::google::protobuf::Any>(arena, *from._impl_.value_);
    } else {
      _this->_impl_.value_->MergeFrom(*from._impl_.value_);
    }
  }
  _this->_impl_._has_bits_[0] |= cached_has_bits;
  _this->_internal_metadata_.MergeFrom<::google::protobuf::UnknownFieldSet>(from._internal_metadata_);
}